

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::GetProgramivActiveUniformBlockMaxNameLengthTest::iterate
          (GetProgramivActiveUniformBlockMaxNameLengthTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  undefined4 extraout_var;
  qpTestResult testResult;
  char *description;
  GLint result_value;
  undefined1 local_1b0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  result_value = 0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x113);
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
  if (bVar2) {
    bVar2 = initTest(this);
    if (bVar2) {
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x9d8))(this->m_po_id,0x8a35,&result_value);
      iVar3 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
      if (iVar3 == 0) {
        if (result_value == 6) goto LAB_00ae5f34;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"glGetIntegerv() returned an invalid value of ");
        std::ostream::operator<<(poVar1,result_value);
        std::operator<<((ostream *)poVar1," instead of the expected value of ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,
                        " for the GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, where the longest uniform block name is data2."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"glGetIntegerv() generated error [");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"] for GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    }
    testResult = QP_TEST_RESULT_FAIL;
    description = "Fail";
  }
LAB_00ae5f34:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetProgramivActiveUniformBlockMaxNameLengthTest::iterate()
{
	bool result = true;

	/* Execute the query */
	glw::GLenum			  error_code			= GL_NO_ERROR;
	const glw::GLint	  expected_result_value = static_cast<glw::GLint>(strlen("data2") + 1 /* terminator */);
	const glw::Functions& gl					= m_context.getRenderContext().getFunctions();
	glw::GLint			  result_value			= 0;

	/* Only execute if we're daeling with GL 3.1 or newer.. */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 1)))
	{
		goto end;
	}

	/* Set up the test program object */
	if (!initTest())
	{
		result = false;

		goto end;
	}

	gl.getProgramiv(m_po_id, GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, &result_value);

	error_code = gl.getError();

	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() generated error [" << error_code
						   << "] for GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH" << tcu::TestLog::EndMessage;

		result = false;
	}
	else if (result_value != expected_result_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned an invalid value of " << result_value
						   << " instead of the expected value of " << (strlen("data2") + 1 /* terminator */)
						   << " for the GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, "
							  "where the longest uniform block name is data2."
						   << tcu::TestLog::EndMessage;

		result = false;
	}
end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}